

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::ParseString(Parser *this,Value *val,bool use_string_pooling)

{
  bool bVar1;
  Offset<flatbuffers::String> t;
  byte in_CL;
  undefined7 in_register_00000011;
  string local_b8;
  string_view local_98;
  offset_type local_84;
  string local_80;
  uint local_60;
  byte local_49;
  undefined1 local_48 [8];
  string s;
  bool use_string_pooling_local;
  Value *val_local;
  Parser *this_local;
  CheckedError *ce;
  
  s.field_2._M_local_buf[0xf] = in_CL & 1;
  std::__cxx11::string::string((string *)local_48,(string *)&(val->constant)._M_string_length);
  local_49 = 0;
  Expect(this,(int)val);
  bVar1 = CheckedError::Check((CheckedError *)this);
  if (bVar1) {
    local_49 = 1;
  }
  local_60 = (uint)bVar1;
  if ((local_49 & 1) == 0) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if (local_60 == 0) {
    if ((s.field_2._M_local_buf[0xf] & 1U) == 0) {
      t = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                    ((FlatBufferBuilderImpl<false> *)&val[6].type.fixed_length,(string *)local_48);
      NumToString<unsigned_int>(&local_b8,t.o);
      std::__cxx11::string::operator=
                ((string *)(CONCAT71(in_register_00000011,use_string_pooling) + 0x20),
                 (string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
      local_98 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
      local_84 = (offset_type)
                 FlatBufferBuilderImpl<false>::CreateSharedString
                           ((FlatBufferBuilderImpl<false> *)&val[6].type.fixed_length,local_98);
      NumToString<unsigned_int>(&local_80,local_84);
      std::__cxx11::string::operator=
                ((string *)(CONCAT71(in_register_00000011,use_string_pooling) + 0x20),
                 (string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    anon_unknown_0::NoError();
    local_60 = 1;
  }
  std::__cxx11::string::~string((string *)local_48);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseString(Value &val, bool use_string_pooling) {
  auto s = attribute_;
  EXPECT(kTokenStringConstant);
  if (use_string_pooling) {
    val.constant = NumToString(builder_.CreateSharedString(s).o);
  } else {
    val.constant = NumToString(builder_.CreateString(s).o);
  }
  return NoError();
}